

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::UninterpretedOption::ByteSizeLong(UninterpretedOption *this)

{
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *this_00;
  uint uVar1;
  void **ppvVar2;
  const_iterator cVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  
  lVar7 = (long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.name_;
  ppvVar2 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar3 = RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::end(this_00);
  for (; ppvVar2 != cVar3.it_; ppvVar2 = ppvVar2 + 1) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption_NamePart>
                      ((UninterpretedOption_NamePart *)*ppvVar2);
    lVar7 = lVar7 + sVar4;
  }
  uVar1 = *(uint *)&this->field_0;
  sVar4 = (ulong)((uVar1 & 0x20) >> 5) * 9 + lVar7;
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.identifier_value_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + sVar5 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.string_value_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + sVar5 + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar5 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.aggregate_value_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar4 = sVar4 + sVar5 + 1;
    }
    if ((uVar1 & 8) != 0) {
      uVar6 = (this->field_0)._impl_.positive_int_value_ | 1;
      lVar7 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar7 * 9 + 0x89U >> 6);
    }
    if ((uVar1 & 0x10) != 0) {
      uVar6 = (this->field_0)._impl_.negative_int_value_ | 1;
      lVar7 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
        }
      }
      sVar4 = sVar4 + ((int)lVar7 * 9 + 0x89U >> 6);
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t UninterpretedOption::ByteSizeLong() const {
  const UninterpretedOption& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.UninterpretedOption)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
    {
      total_size += 1UL * this_._internal_name_size();
      for (const auto& msg : this_._internal_name()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000020u & cached_has_bits) * 9;
  if ((cached_has_bits & 0x0000001fu) != 0) {
    // optional string identifier_value = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_identifier_value());
    }
    // optional bytes string_value = 7;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_string_value());
    }
    // optional string aggregate_value = 8;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_aggregate_value());
    }
    // optional uint64 positive_int_value = 4;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_positive_int_value());
    }
    // optional int64 negative_int_value = 5;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_negative_int_value());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}